

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar3;
  double *pdVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  value_type vVar10;
  double dVar11;
  double dVar12;
  
  uVar1 = (((fadexpr->fadexpr_).left_)->fadexpr_).expr_.dx_.num_elts;
  uVar2 = (((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar4 = (this->dx_).ptr_to_data;
        if (pdVar4 != (double *)0x0) {
          operator_delete__(pdVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar4 = (this->dx_).ptr_to_data;
        if (pdVar4 != (double *)0x0) {
          operator_delete__(pdVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar5 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar5 = (long)(int)uVar2 << 3;
      }
      pdVar4 = (double *)operator_new__(uVar5);
      (this->dx_).ptr_to_data = pdVar4;
    }
  }
  if (uVar2 != 0) {
    pdVar4 = (this->dx_).ptr_to_data;
    if (((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.dx_.num_elts == 0) ||
       ((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts == 0)) {
      if (0 < (int)uVar2) {
        uVar5 = 0;
        do {
          vVar10 = FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar5);
          pdVar4[uVar5] = vVar10;
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
    }
    else if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        pFVar3 = (fadexpr->fadexpr_).left_;
        dVar11 = (pFVar3->fadexpr_).expr_.dx_.ptr_to_data[uVar5];
        dVar6 = cos((pFVar3->fadexpr_).expr_.val_);
        dVar7 = sin((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
        pFVar3 = (fadexpr->fadexpr_).right_;
        dVar12 = (pFVar3->fadexpr_).expr_.dx_.ptr_to_data[uVar5];
        dVar8 = cos((pFVar3->fadexpr_).expr_.val_);
        dVar9 = sin((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
        pdVar4[uVar5] = dVar7 * dVar6 * dVar11 + dVar9 * dVar8 * dVar12;
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
  }
  dVar11 = sin((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
  dVar12 = sin((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar12 * dVar11;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}